

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

Literal * __thiscall wasm::Literal::convertSIToF16(Literal *__return_storage_ptr__,Literal *this)

{
  uint uVar1;
  anon_union_4_2_5fd15f10 fp32;
  float fVar2;
  float fVar3;
  
  if ((this->type).id == 2) {
    fVar2 = (float)(this->field_0).i32;
    fVar3 = 2.0;
    if (0x70ffffff < (uint)((int)fVar2 * 2)) {
      fVar3 = (float)(((uint)fVar2 & 0x7f800000) + 0x7800000);
    }
    fVar3 = fVar3 + ABS(fVar2) * 5.192297e+33 * 7.70372e-34;
    uVar1 = 0x7e00;
    if ((uint)((int)fVar2 * 2) < 0xff000001) {
      uVar1 = ((uint)fVar3 & 0xfff) + ((uint)fVar3 >> 0xd & 0x7c00);
    }
    (__return_storage_ptr__->field_0).i32 = uVar1 | (uint)fVar2 >> 0x10 & 0x8000;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  }
  handle_unreachable("invalid type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                     ,0x330);
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }